

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

void S_PrecacheLevel(void)

{
  ushort *puVar1;
  uint uVar2;
  long lVar3;
  DThinker *pDVar4;
  ulong uVar5;
  FSoundChan *pFVar6;
  sfxinfo_t *psVar7;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_30;
  
  if (GSnd != (SoundRenderer *)0x0) {
    if (S_sfx.Count != 0) {
      lVar3 = 0x30;
      uVar5 = 0;
      do {
        puVar1 = (ushort *)((long)&((S_sfx.Array)->data).data + lVar3);
        *puVar1 = *puVar1 & 0xffdf;
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x50;
      } while (uVar5 < S_sfx.Count);
    }
    FThinkerIterator::FThinkerIterator(&local_30,AActor::RegistrationInfo.MyClass,0x80);
    pDVar4 = FThinkerIterator::Next(&local_30,false);
    if (pDVar4 != (DThinker *)0x0) {
      do {
        (*(pDVar4->super_DObject)._vptr_DObject[0xc])(pDVar4);
        pDVar4 = FThinkerIterator::Next(&local_30,false);
      } while (pDVar4 != (DThinker *)0x0);
    }
    pFVar6 = Channels;
    if (((level.info)->PrecacheSounds).Count != 0) {
      uVar5 = 0;
      do {
        sfxinfo_t::MarkUsed(S_sfx.Array + ((level.info)->PrecacheSounds).Array[uVar5].ID);
        uVar5 = uVar5 + 1;
        pFVar6 = Channels;
      } while (uVar5 < ((level.info)->PrecacheSounds).Count);
    }
    for (; pFVar6 != (FSoundChan *)0x0; pFVar6 = pFVar6->NextChan) {
      sfxinfo_t::MarkUsed(S_sfx.Array + (pFVar6->SoundID).ID);
    }
    if (1 < S_sfx.Count) {
      uVar5 = 1;
      lVar3 = 0x50;
      psVar7 = S_sfx.Array;
      uVar2 = S_sfx.Count;
      do {
        if (((&psVar7->field_0x30)[lVar3] & 0x20) != 0) {
          S_CacheSound((sfxinfo_t *)((long)&(psVar7->data).data + lVar3));
          psVar7 = S_sfx.Array;
          uVar2 = S_sfx.Count;
        }
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 0x50;
      } while (uVar5 < uVar2);
      if (1 < uVar2) {
        uVar5 = 1;
        lVar3 = 0x50;
        psVar7 = S_sfx.Array;
        do {
          if ((((&psVar7->field_0x30)[lVar3] & 0x20) == 0) &&
             (*(int *)((long)&psVar7->link + lVar3) == -1)) {
            S_UnloadSound((sfxinfo_t *)((long)&(psVar7->data).data + lVar3));
            psVar7 = S_sfx.Array;
            uVar2 = S_sfx.Count;
          }
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x50;
        } while (uVar5 < uVar2);
      }
    }
  }
  return;
}

Assistant:

void S_PrecacheLevel ()
{
	unsigned int i;

	if (GSnd)
	{
		for (i = 0; i < S_sfx.Size(); ++i)
		{
			S_sfx[i].bUsed = false;
		}

		AActor *actor;
		TThinkerIterator<AActor> iterator;

		// Precache all sounds known to be used by the currently spawned actors.
		while ( (actor = iterator.Next()) != NULL )
		{
			actor->MarkPrecacheSounds();
		}
		// Precache all extra sounds requested by this map.
		for (i = 0; i < level.info->PrecacheSounds.Size(); ++i)
		{
			level.info->PrecacheSounds[i].MarkUsed();
		}
		// Don't unload sounds that are playing right now.
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			chan->SoundID.MarkUsed();
		}

		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (S_sfx[i].bUsed)
			{
				S_CacheSound (&S_sfx[i]);
			}
		}
		for (i = 1; i < S_sfx.Size(); ++i)
		{
			if (!S_sfx[i].bUsed && S_sfx[i].link == sfxinfo_t::NO_LINK)
			{
				S_UnloadSound (&S_sfx[i]);
			}
		}
	}
}